

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure
          (UnsignedLongLongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          cpputest_ulonglong expected,cpputest_ulonglong actual,SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  char *pcVar2;
  SimpleString aDecimal;
  SimpleString expectedReported;
  SimpleString eDecimal;
  SimpleString actualReported;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0012daf8;
  TestFailure::createUserText((TestFailure *)&local_80,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&local_80);
  SimpleString::~SimpleString(&local_80);
  StringFrom((cpputest_ulonglong)&local_80);
  StringFrom((cpputest_ulonglong)&local_50);
  SimpleString::padStringsToSameLength(&local_80,&local_50,' ');
  SimpleString::SimpleString(&local_90," ");
  SimpleString::operator+(&local_60,&local_80);
  BracketsFormattedHexStringFrom((cpputest_ulonglong)&local_70);
  SimpleString::operator+(&local_30,&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_70," ");
  SimpleString::operator+(&local_90,&local_50);
  BracketsFormattedHexStringFrom((cpputest_ulonglong)&local_40);
  SimpleString::operator+(&local_60,&local_90);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_70);
  pcVar1 = SimpleString::asCharString(&local_60);
  pcVar2 = SimpleString::asCharString(&local_30);
  StringFromFormat((char *)&local_90,"expected <%s>\n\tbut was  <%s>",pcVar1,pcVar2);
  SimpleString::operator+=(this_00,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, cpputest_ulonglong expected, cpputest_ulonglong actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}